

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
t_cpp_generator::generate_enum_to_string_helper_function_decl
          (t_cpp_generator *this,ostream *out,t_enum *tenum)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  
  std::operator<<(out,"std::string to_string(const ");
  bVar1 = this->gen_pure_enums_;
  iVar2 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])(tenum);
  poVar3 = std::operator<<(out,(string *)CONCAT44(extraout_var,iVar2));
  if (bVar1 == false) {
    std::operator<<(poVar3,"::type&");
  }
  poVar3 = std::operator<<(out," val);");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_cpp_generator::generate_enum_to_string_helper_function_decl(std::ostream& out, t_enum* tenum) {
  out << "std::string to_string(const ";
  if (gen_pure_enums_) {
    out << tenum->get_name();
  } else {
    out << tenum->get_name() << "::type&";
  }
  out << " val);" << endl;
  out << endl;
}